

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O0

void __thiscall
dxil_spv::Converter::Impl::emit_interpolation_decorations
          (Impl *this,Id variable_id,InterpolationMode mode)

{
  Builder *this_00;
  Builder *builder;
  InterpolationMode mode_local;
  Id variable_id_local;
  Impl *this_local;
  
  this_00 = SPIRVModule::get_builder(this->spirv_module);
  switch(mode) {
  case Constant:
    spv::Builder::addDecoration(this_00,variable_id,DecorationFlat,-1);
    break;
  default:
    break;
  case LinearCentroid:
    spv::Builder::addDecoration(this_00,variable_id,DecorationCentroid,-1);
    break;
  case LinearNoperspective:
    spv::Builder::addDecoration(this_00,variable_id,DecorationNoPerspective,-1);
    break;
  case LinearNoperspectiveCentroid:
    spv::Builder::addDecoration(this_00,variable_id,DecorationNoPerspective,-1);
    spv::Builder::addDecoration(this_00,variable_id,DecorationCentroid,-1);
    break;
  case LinearSample:
    spv::Builder::addDecoration(this_00,variable_id,DecorationSample,-1);
    spv::Builder::addCapability(this_00,CapabilitySampleRateShading);
    (this->execution_mode_meta).per_sample_shading = true;
    break;
  case LinearNoperspectiveSample:
    spv::Builder::addDecoration(this_00,variable_id,DecorationNoPerspective,-1);
    spv::Builder::addDecoration(this_00,variable_id,DecorationSample,-1);
    spv::Builder::addCapability(this_00,CapabilitySampleRateShading);
    (this->execution_mode_meta).per_sample_shading = true;
  }
  return;
}

Assistant:

void Converter::Impl::emit_interpolation_decorations(spv::Id variable_id, DXIL::InterpolationMode mode)
{
	auto &builder = spirv_module.get_builder();
	switch (mode)
	{
	case DXIL::InterpolationMode::Constant:
		builder.addDecoration(variable_id, spv::DecorationFlat);
		break;

	case DXIL::InterpolationMode::LinearCentroid:
		builder.addDecoration(variable_id, spv::DecorationCentroid);
		break;

	case DXIL::InterpolationMode::LinearSample:
		builder.addDecoration(variable_id, spv::DecorationSample);
		builder.addCapability(spv::CapabilitySampleRateShading);
		execution_mode_meta.per_sample_shading = true;
		break;

	case DXIL::InterpolationMode::LinearNoperspective:
		builder.addDecoration(variable_id, spv::DecorationNoPerspective);
		break;

	case DXIL::InterpolationMode::LinearNoperspectiveCentroid:
		builder.addDecoration(variable_id, spv::DecorationNoPerspective);
		builder.addDecoration(variable_id, spv::DecorationCentroid);
		break;

	case DXIL::InterpolationMode::LinearNoperspectiveSample:
		builder.addDecoration(variable_id, spv::DecorationNoPerspective);
		builder.addDecoration(variable_id, spv::DecorationSample);
		builder.addCapability(spv::CapabilitySampleRateShading);
		execution_mode_meta.per_sample_shading = true;
		break;

	default:
		break;
	}
}